

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinJoin
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  pointer pFVar2;
  pointer ppHVar3;
  anon_union_8_3_4e909c26_for_v aVar4;
  undefined4 uVar5;
  AST *pAVar6;
  RuntimeError *pRVar7;
  Type t;
  Type t_00;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1->t == ARRAY) {
    if (pVVar1[1].t == ARRAY) {
      pFVar2 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar2[-1].kind = FRAME_BUILTIN_JOIN_ARRAYS;
      uVar5 = *(undefined4 *)&pVVar1->field_0x4;
      aVar4 = pVVar1->v;
      pFVar2[-1].val.t = pVVar1->t;
      *(undefined4 *)&pFVar2[-1].val.field_0x4 = uVar5;
      pFVar2[-1].val.v = aVar4;
      pVVar1 = (args->
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined4 *)&pVVar1[1].field_0x4;
      aVar4 = pVVar1[1].v;
      pFVar2[-1].val2.t = pVVar1[1].t;
      *(undefined4 *)&pFVar2[-1].val2.field_0x4 = uVar5;
      pFVar2[-1].val2.v = aVar4;
      ppHVar3 = pFVar2[-1].thunks.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pFVar2[-1].thunks.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppHVar3) {
        pFVar2[-1].thunks.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppHVar3;
      }
      pFVar2[-1].first = true;
      pFVar2[-1].elementId = 0;
      pAVar6 = joinArrays(this);
      return pAVar6;
    }
  }
  else {
    if (pVVar1->t != STRING) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,"join first parameter should be string or array, got ",0x34);
      (anonymous_namespace)::type_str_abi_cxx11_
                (&local_1d0,
                 (_anonymous_namespace_ *)
                 (ulong)((args->
                         super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         )._M_impl.super__Vector_impl_data._M_start)->t,t_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      pRVar7 = (RuntimeError *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      Stack::makeError(pRVar7,&this->stack,loc,&local_1d0);
      __cxa_throw(pRVar7,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    if (pVVar1[1].t == ARRAY) {
      pFVar2 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar2[-1].kind = FRAME_BUILTIN_JOIN_STRINGS;
      uVar5 = *(undefined4 *)&pVVar1->field_0x4;
      aVar4 = pVVar1->v;
      pFVar2[-1].val.t = pVVar1->t;
      *(undefined4 *)&pFVar2[-1].val.field_0x4 = uVar5;
      pFVar2[-1].val.v = aVar4;
      pVVar1 = (args->
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined4 *)&pVVar1[1].field_0x4;
      aVar4 = pVVar1[1].v;
      pFVar2[-1].val2.t = pVVar1[1].t;
      *(undefined4 *)&pFVar2[-1].val2.field_0x4 = uVar5;
      pFVar2[-1].val2.v = aVar4;
      pFVar2[-1].str._M_string_length = 0;
      *pFVar2[-1].str._M_dataplus._M_p = L'\0';
      pFVar2[-1].first = true;
      pFVar2[-1].elementId = 0;
      pAVar6 = joinStrings(this);
      return pAVar6;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"join second parameter should be array, got ",0x2b);
  (anonymous_namespace)::type_str_abi_cxx11_
            (&local_1d0,
             (_anonymous_namespace_ *)
             (ulong)(args->
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                    )._M_impl.super__Vector_impl_data._M_start[1].t,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pRVar7 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar7,&this->stack,loc,&local_1d0);
  __cxa_throw(pRVar7,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinJoin(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args[0].t != Value::ARRAY && args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "join first parameter should be string or array, got " << type_str(args[0]);
            throw makeError(loc, ss.str());
        }
        if (args[1].t != Value::ARRAY) {
            std::stringstream ss;
            ss << "join second parameter should be array, got " << type_str(args[1]);
            throw makeError(loc, ss.str());
        }
        Frame &f = stack.top();
        if (args[0].t == Value::STRING) {
            f.kind = FRAME_BUILTIN_JOIN_STRINGS;
            f.val = args[0];  // sep
            f.val2 = args[1];  // arr
            f.str.clear();
            f.first = true;
            f.elementId = 0;
            return joinStrings();
        } else {
            f.kind = FRAME_BUILTIN_JOIN_ARRAYS;
            f.val = args[0];  // sep
            f.val2 = args[1];  // arr
            f.thunks.clear();
            f.first = true;
            f.elementId = 0;
            return joinArrays();
        }
    }